

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

int __thiscall
QtMWidgets::AbstractScrollAreaPrivate::init(AbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  AbstractScrollArea *pAVar1;
  int iVar2;
  QColor *pQVar3;
  QWidget *pQVar4;
  ScrollIndicator *pSVar5;
  BlurEffect *pBVar6;
  QVariantAnimation *pQVar7;
  QTimer *pQVar8;
  Scroller *this_00;
  QLatin1String local_a8;
  QString local_98;
  QFlags<Qt::WindowType> local_7c;
  undefined1 auStack_78 [8];
  QColor ic;
  QStyleOption local_50 [8];
  QStyleOption opt;
  QPalette local_28 [24];
  AbstractScrollAreaPrivate *local_10;
  AbstractScrollAreaPrivate *this_local;
  
  local_10 = this;
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  pQVar3 = QPalette::color(local_28,Highlight);
  auStack_78 = *(undefined1 (*) [8])pQVar3;
  ic._0_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
  pQVar4 = (QWidget *)operator_new(0x28);
  pAVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_7c);
  QWidget::QWidget(pQVar4,(QWidget *)pAVar1,(QFlags_conflict1 *)(ulong)local_7c.i);
  this->viewport = pQVar4;
  pQVar4 = this->viewport;
  QLatin1String::QLatin1String(&local_a8,"qt_scrollarea_viewport");
  QString::QString(&local_98,local_a8);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_98);
  QWidget::setBackgroundRole((ColorRole)this->viewport);
  QWidget::setAutoFillBackground(SUB81(this->viewport,0));
  QWidget::setFocusProxy(this->viewport);
  QWidget::setContentsMargins((int)this->viewport,0,0,0);
  pSVar5 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar5,(QColor *)auStack_78,Horizontal,this->viewport);
  this->horIndicator = pSVar5;
  pSVar5 = (ScrollIndicator *)operator_new(0x60);
  ScrollIndicator::ScrollIndicator(pSVar5,(QColor *)auStack_78,Vertical,this->viewport);
  this->vertIndicator = pSVar5;
  pBVar6 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar6,(QColor *)auStack_78,Vertical,this->viewport);
  this->horBlur = pBVar6;
  pBVar6 = (BlurEffect *)operator_new(0x50);
  BlurEffect::BlurEffect(pBVar6,(QColor *)auStack_78,Horizontal,this->viewport);
  this->vertBlur = pBVar6;
  pQVar7 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar7,(QObject *)this->q);
  this->horBlurAnim = pQVar7;
  QVariantAnimation::setDuration((int)this->horBlurAnim);
  QAbstractAnimation::setLoopCount((int)this->horBlurAnim);
  pQVar7 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar7,(QObject *)this->q);
  this->vertBlurAnim = pQVar7;
  QVariantAnimation::setDuration((int)this->vertBlurAnim);
  QAbstractAnimation::setLoopCount((int)this->vertBlurAnim);
  pQVar8 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar8,(QObject *)this->q);
  this->animationTimer = pQVar8;
  QTimer::setSingleShot(SUB81(this->animationTimer,0));
  pQVar8 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(pQVar8,(QObject *)this->q);
  this->startBlurAnimTimer = pQVar8;
  QTimer::setSingleShot(SUB81(this->startBlurAnimTimer,0));
  this_00 = (Scroller *)operator_new(0x18);
  Scroller::Scroller(this_00,(QObject *)this->q,(QObject *)this->q);
  this->scroller = this_00;
  QWidget::setFocusPolicy((FocusPolicy)this->q);
  QFrame::setFrameStyle((int)this->q);
  QWidget::setSizePolicy((QWidget *)this->q,Expanding,Expanding);
  layoutChildren(this,local_50);
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
AbstractScrollAreaPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	const QColor ic = opt.palette.color( QPalette::Highlight );

	viewport = new QWidget( q );
	viewport->setObjectName( QLatin1String( "qt_scrollarea_viewport" ) );
	viewport->setBackgroundRole( QPalette::Base );
	viewport->setAutoFillBackground( true );
	viewport->setFocusProxy( q );
	viewport->setContentsMargins( 0, 0, 0, 0 );

	horIndicator = new ScrollIndicator( ic, Qt::Horizontal, viewport );
	vertIndicator = new ScrollIndicator( ic, Qt::Vertical, viewport );

	horBlur = new BlurEffect( ic, Qt::Vertical, viewport );
	vertBlur = new BlurEffect( ic, Qt::Horizontal, viewport );

	horBlurAnim = new QVariantAnimation( q );
	horBlurAnim->setDuration( 300 );
	horBlurAnim->setLoopCount( 1 );

	vertBlurAnim = new QVariantAnimation( q );
	vertBlurAnim->setDuration( 300 );
	vertBlurAnim->setLoopCount( 1 );

	animationTimer = new QTimer( q );
	animationTimer->setSingleShot( true );

	startBlurAnimTimer = new QTimer( q );
	startBlurAnimTimer->setSingleShot( true );

	scroller = new Scroller( q, q );

	q->setFocusPolicy( Qt::WheelFocus );
	q->setFrameStyle( QFrame::NoFrame | QFrame::Plain );
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Expanding );

	layoutChildren( opt );
}